

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool __thiscall
ON_NurbsSurface::IsDuplicate
          (ON_NurbsSurface *this,ON_NurbsSurface *other,bool bIgnoreParameterization,
          double tolerance)

{
  int iVar1;
  int dim;
  int count;
  int stride;
  int other_stride;
  bool bVar2;
  bool bVar3;
  double *cv;
  double *other_cv;
  int i;
  
  if (this == other) {
    bVar3 = true;
  }
  else if (((((this->m_dim == other->m_dim) && (this->m_is_rat == other->m_is_rat)) &&
            (this->m_order[0] == other->m_order[0])) &&
           ((this->m_order[1] == other->m_order[1] && (this->m_cv_count[0] == other->m_cv_count[0]))
           )) && (this->m_cv_count[1] == other->m_cv_count[1])) {
    bVar2 = ON_IsDuplicateKnotVector
                      (this->m_order[0],this->m_cv_count[0],this->m_knot[0],other->m_knot[0],
                       bIgnoreParameterization);
    bVar3 = false;
    i = 0;
    if (bVar2) {
      bVar3 = ON_IsDuplicateKnotVector
                        (this->m_order[1],this->m_cv_count[1],this->m_knot[1],other->m_knot[1],
                         bIgnoreParameterization);
      i = 0;
    }
    for (; (bVar3 != false && (i < this->m_cv_count[0])); i = i + 1) {
      iVar1 = this->m_is_rat;
      dim = this->m_dim;
      count = this->m_cv_count[1];
      stride = this->m_cv_stride[1];
      cv = CV(this,i,0);
      other_stride = other->m_cv_stride[1];
      other_cv = CV(other,i,0);
      bVar3 = ON_IsDuplicatePointList
                        (dim,iVar1 != 0,count,stride,cv,other_stride,other_cv,tolerance);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_NurbsSurface::IsDuplicate( 
        const ON_NurbsSurface& other, 
        bool bIgnoreParameterization,
        double tolerance 
        ) const
{
  bool rc = (this == &other);
  if ( !rc
       && m_dim      == other.m_dim
       && m_is_rat   == other.m_is_rat
       && m_order[0] == other.m_order[0]
       && m_order[1] == other.m_order[1]
       && m_cv_count[0] == other.m_cv_count[0]
       && m_cv_count[1] == other.m_cv_count[1]
       )
  {
    // compare knots
    rc = ON_IsDuplicateKnotVector( m_order[0], m_cv_count[0], m_knot[0], other.m_knot[0], bIgnoreParameterization );
    if (rc)
      rc = ON_IsDuplicateKnotVector( m_order[1], m_cv_count[1], m_knot[1], other.m_knot[1], bIgnoreParameterization );

    // compare control points
    int i;
    for ( i = 0; i < m_cv_count[0] && rc; i++ )
    {
      rc = ON_IsDuplicatePointList( m_dim, m_is_rat?1:0, m_cv_count[1],
                                    m_cv_stride[1], CV(i,0),
                                    other.m_cv_stride[1], other.CV(i,0),
                                    tolerance );
    }
  }
  return rc;
}